

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::AnyOfMatcherImpl<const_google::protobuf::FieldDescriptor_*const_&>::DescribeTo
          (AnyOfMatcherImpl<const_google::protobuf::FieldDescriptor_*const_&> *this,ostream *os)

{
  size_type sVar1;
  MatcherBase<const_google::protobuf::FieldDescriptor_*const_&> *this_00;
  ulong local_20;
  size_t i;
  ostream *os_local;
  AnyOfMatcherImpl<const_google::protobuf::FieldDescriptor_*const_&> *this_local;
  
  std::operator<<(os,"(");
  local_20 = 0;
  while( true ) {
    sVar1 = std::
            vector<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
            ::size(&this->matchers_);
    if (sVar1 <= local_20) break;
    if (local_20 != 0) {
      std::operator<<(os,") or (");
    }
    this_00 = &std::
               vector<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
               ::operator[](&this->matchers_,local_20)->
               super_MatcherBase<const_google::protobuf::FieldDescriptor_*const_&>;
    MatcherBase<const_google::protobuf::FieldDescriptor_*const_&>::DescribeTo(this_00,os);
    local_20 = local_20 + 1;
  }
  std::operator<<(os,")");
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const override {
    *os << "(";
    for (size_t i = 0; i < matchers_.size(); ++i) {
      if (i != 0) *os << ") or (";
      matchers_[i].DescribeTo(os);
    }
    *os << ")";
  }